

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UndoMove.cpp
# Opt level: O2

void __thiscall UndoMove::PutMove(UndoMove *this,Move move,size_t row,size_t col)

{
  size_type sVar1;
  unsigned_long local_28;
  
  sVar1 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->moveStack);
  if (sVar1 == 10) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->moveStack);
  }
  switch(move) {
  case UP:
    local_28 = (row * 10 + col) - 10;
    break;
  case RIGHT:
    local_28 = row * 10 + col + 1;
    break;
  case DOWN:
    local_28 = row * 10 + col + 10;
    break;
  case LEFT:
    local_28 = (row * 10 + col) - 1;
    break;
  default:
    goto switchD_0011652e_default;
  }
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->moveStack,&local_28);
switchD_0011652e_default:
  return;
}

Assistant:

void UndoMove::PutMove( Move move, size_t row, size_t col )
{
    if ( moveStack.size() == MOVE_STACK_LIMIT )
    {
        moveStack.pop_front();
    }

    switch ( move )
    {
        case Move::UP:
            moveStack.push_back(( row - 1 ) * 10 + col );
            break;
        case Move::RIGHT:
            moveStack.push_back( row * 10 + col + 1 );
            break;
        case Move::DOWN:
            moveStack.push_back(( row + 1 ) * 10 + col );
            break;
        case Move::LEFT:
            moveStack.push_back( row * 10 + col -1  );
            break;
    }
}